

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::validate_compare_to_all_valid_elements
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *this,const_iterator *it)

{
  ulong uVar1;
  const_iterator cur;
  polymorphic_allocator<char> local_28;
  polymorphic_allocator<char> local_20;
  
  end((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
       *)&local_28);
  if (local_28._M_resource != (memory_resource *)it->p_) {
    begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)&local_28);
    while( true ) {
      end((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)&local_20);
      if (local_28._M_resource == local_20._M_resource) {
        std::terminate();
      }
      if (local_28._M_resource == (memory_resource *)it->p_) break;
      uVar1 = *(ulong *)local_28._M_resource;
      if (uVar1 == 0) {
        uVar1 = *(ulong *)(local_28._M_resource + 0x10) + 0x1f & 0xfffffffffffffff8;
      }
      local_28._M_resource = local_28._M_resource + uVar1;
    }
  }
  return;
}

Assistant:

void validate_compare_to_all_valid_elements([[maybe_unused]] const_iterator const &it) const noexcept {
#ifdef FFL_DBG_CHECK_ITERATOR_VALID
        //
        // If not end iterator then must point to one of the valid iterators.
        //
        if (end() != it) {
            bool found_match{ false };
            for (auto cur = cbegin(); cur != cend(); ++cur) {
                if (cur == it) {
                    found_match = true;
                    break;
                }
            }
            FFL_CODDING_ERROR_IF_NOT(found_match);
        }
#else //FFL_DBG_CHECK_ITERATOR_VALID
        it;
#endif //FFL_DBG_CHECK_ITERATOR_VALID
    }